

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  undefined4 *puVar5;
  BigNumber *pBVar6;
  int r;
  ulong uVar7;
  byte bVar8;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  BigNumber encrypt;
  BigNumber resultat;
  BigNumber n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> real_r21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> d1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> q1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> p1;
  BigNumber m;
  BigNumber v;
  BigNumber q;
  BigNumber p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inv_r;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n1;
  BigNumber decrypt;
  BigNumber real_r2;
  BigNumber local_3b0;
  BigNumber local_390;
  BigNumber local_370;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_308;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_230;
  BigNumber local_218;
  BigNumber local_1f8;
  BigNumber local_1d8;
  BigNumber local_1b8;
  BigNumber local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  BigNumber local_148;
  BigNumber local_128;
  BigNumber local_108;
  BigNumber local_e8;
  BigNumber local_c8;
  BigNumber local_a8 [4];
  
  bVar8 = 0;
  puVar5 = &DAT_00106004;
  pBVar6 = local_a8;
  for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + 1;
    pBVar6 = (BigNumber *)
             ((long)&(pBVar6->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4);
  }
  __l._M_len = 0x11;
  __l._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_230,__l,(allocator_type *)&local_3b0);
  puVar5 = &DAT_00106048;
  pBVar6 = local_a8;
  for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  __l_00._M_len = 0x11;
  __l_00._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_248,__l_00,(allocator_type *)&local_3b0);
  puVar5 = &DAT_0010608c;
  pBVar6 = local_a8;
  for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  __l_01._M_len = 0x11;
  __l_01._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_260,__l_01,(allocator_type *)&local_3b0);
  memcpy(local_a8,&DAT_001060d0,0x84);
  __l_02._M_len = 0x21;
  __l_02._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_160,__l_02,(allocator_type *)&local_3b0);
  memcpy(local_a8,&DAT_00106154,0x84);
  __l_03._M_len = 0x21;
  __l_03._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_278,__l_03,(allocator_type *)&local_3b0);
  puVar5 = &DAT_001061d8;
  pBVar6 = local_a8;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  __l_04._M_len = 0x20;
  __l_04._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_290,__l_04,(allocator_type *)&local_3b0);
  puVar5 = &DAT_00106258;
  pBVar6 = local_a8;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  __l_05._M_len = 0x20;
  __l_05._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_2a8,__l_05,(allocator_type *)&local_3b0);
  puVar5 = &DAT_001062d8;
  pBVar6 = local_a8;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  __l_06._M_len = 0x20;
  __l_06._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_178,__l_06,(allocator_type *)&local_3b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2c0,&local_260);
  BigNumber::BigNumber(&local_3b0,&local_2c0,0x100000000,1);
  if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2d8,&local_230);
  BigNumber::BigNumber(&local_198,&local_2d8,0x100000000,1);
  if (local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2f0,&local_248);
  BigNumber::BigNumber(&local_1b8,&local_2f0,0x100000000,1);
  if (local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_308,&local_290);
  BigNumber::BigNumber(&local_c8,&local_308,0x100000000,1);
  if (local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_320,&local_278);
  BigNumber::BigNumber(&local_1d8,&local_320,0x100000000,1);
  if (local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar5 = &DAT_00106358;
  pBVar6 = local_a8;
  for (lVar4 = 0x1e; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  __l_07._M_len = 0x1e;
  __l_07._M_array = (iterator)local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_338,__l_07,(allocator_type *)&local_370);
  BigNumber::BigNumber(&local_1f8,&local_338,0x100000000,1);
  if (local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_350,&local_2a8);
  BigNumber::BigNumber(local_a8,&local_350,0x100000000,1);
  if (local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_218,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
  local_218.m_base = local_198.m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8);
  local_e8.m_base = local_1b8.m_base;
  operator*(&local_370,&local_218,&local_e8);
  if (local_e8.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar7 = (long)local_370.super_Polynome.m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_370.super_Polynome.m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  clock();
  r = (int)(uVar7 >> 2);
  BigNumber::m_square_and_multiply
            (&local_390,&local_1f8,&local_3b0,&local_370,r,&local_1d8,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cipher : ",9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_390);
  local_108.m_base = local_390.m_base;
  poVar2 = operator<<((ostream *)&std::cout,&local_108);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_108.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BigNumber::m_square_and_multiply(&local_128,&local_390,&local_c8,&local_370,r,&local_1d8,local_a8)
  ;
  BigNumber::operator=(&local_390,&local_128);
  if (local_128.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Plaintext : ",0xc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_148,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_390);
  local_148.m_base = local_390.m_base;
  poVar2 = operator<<((ostream *)&std::cout,&local_148);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_148.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  clock();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_1c4e,0x1b)
  ;
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_1c64,8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comparaison : ",0xe);
  bVar1 = operator==(&local_390,&local_1f8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)bVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (local_390.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_390.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_390.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_390.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_370.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_370.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8[0].super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8[0].super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8[0].super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8[0].super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3b0.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_230.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    clock_t t1, t2;
    long unsigned int base = 4294967296;

    vector <unsigned int> p1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 75};
    vector <unsigned int> q1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 145};
    vector <unsigned int> e1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 285};
    vector <unsigned int> n1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 220, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 10875};
    vector <unsigned int> v1 = {1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076, 386586051, 1045080972, 584698610, 415168777, 3068734737, 3564255822, 1704807014, 3640413780, 3181632784, 4176880379, 343992323, 865312491, 2334487511, 1789470971, 3377127848, 432853715, 2287094768, 3608167468, 693513799, 3021682278, 3335659198, 1487342237, 3697028860, 2115296077};
    vector <unsigned int> d1 = {2366988799, 3777567450, 4256133434, 3715635382, 2102803053, 538910050, 2658892395, 2033075339, 2739880485, 223619520, 286417771, 1478718362, 3618622911, 2363957160, 698720772, 3590039000, 325540360, 306051247, 2601868696, 160532541, 846116208, 2547732272, 2242835935, 1222905716, 1111601229, 2197361339, 2284845799, 4005084793, 2365400798, 528660221, 430348475, 4280536789};
    vector <unsigned int> real_r21 = {4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4289104296, 0, 219, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 3886882921, 0, 10875};
    vector <unsigned int> inv_r = {1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076, 386586051, 1045080972, 584698610, 415168777, 3068734737, 3564255822, 1704807081, 955936537, 3573085035, 3713111524, 568534961, 675263962, 789347009, 2028190576, 3016996571, 123683255, 1436680122, 1597747354, 478189140, 4164500159, 4147436048, 3939575293, 797453360};

    BigNumber encrypt (e1, base, 1);
    BigNumber p (p1, base, 1);
    BigNumber q (q1, base, 1);
    BigNumber decrypt (d1, base, 1);
    BigNumber v (v1, base, 1);
    BigNumber m({1,2,3,4, 1462085356, 489085113, 3474155137, 363905627, 567934108, 1462085356, 489085113, 3474155137, 363905627,1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627,1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076,1212, 86537}, base, 1);
    BigNumber real_r2 (real_r21, base, 1);
    BigNumber n = p*q;
    int r = (int) n.m_degre();
    t1 = clock();
    BigNumber resultat = m.m_square_and_multiply(encrypt, n, r, v, real_r2);
    cout << "Cipher : " << resultat << endl;
    resultat = resultat.m_square_and_multiply(decrypt, n, r, v, real_r2);
    cout << "Plaintext : " << resultat << endl;
    t2 = clock();
    cout << "Chiffré et déchiffré en " << (t2 - t1) << " unités" << endl;
    cout << "Comparaison : " << (int)(resultat == m) <<endl;


    return 0;
}